

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

QuadLight * __thiscall
embree::SceneGraph::QuadLight::transform(QuadLight *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined8 uVar29;
  QuadLight *in_RDI;
  
  fVar1 = (this->v0).field_0.m128[0];
  fVar2 = (this->v0).field_0.m128[1];
  fVar3 = (this->v0).field_0.m128[2];
  fVar4 = (space->l).vx.field_0.m128[0];
  fVar5 = (space->l).vx.field_0.m128[1];
  fVar6 = (space->l).vx.field_0.m128[2];
  fVar7 = (space->l).vx.field_0.m128[3];
  fVar8 = (space->l).vy.field_0.m128[0];
  fVar9 = (space->l).vy.field_0.m128[1];
  fVar10 = (space->l).vy.field_0.m128[2];
  fVar11 = (space->l).vy.field_0.m128[3];
  fVar12 = (space->l).vz.field_0.m128[0];
  fVar13 = (space->l).vz.field_0.m128[1];
  fVar14 = (space->l).vz.field_0.m128[2];
  fVar15 = (space->l).vz.field_0.m128[3];
  fVar16 = (space->p).field_0.m128[0];
  fVar17 = (space->p).field_0.m128[1];
  fVar18 = (space->p).field_0.m128[2];
  fVar19 = (space->p).field_0.m128[3];
  fVar20 = (this->v1).field_0.m128[0];
  fVar21 = (this->v1).field_0.m128[1];
  fVar22 = (this->v1).field_0.m128[2];
  fVar23 = (this->v2).field_0.m128[0];
  fVar24 = (this->v2).field_0.m128[1];
  fVar25 = (this->v2).field_0.m128[2];
  fVar26 = (this->v3).field_0.m128[0];
  fVar27 = (this->v3).field_0.m128[1];
  fVar28 = (this->v3).field_0.m128[2];
  (in_RDI->super_Light).type = LIGHT_QUAD;
  (in_RDI->v0).field_0.m128[0] = fVar1 * fVar4 + fVar2 * fVar8 + fVar3 * fVar12 + fVar16;
  (in_RDI->v0).field_0.m128[1] = fVar1 * fVar5 + fVar2 * fVar9 + fVar3 * fVar13 + fVar17;
  (in_RDI->v0).field_0.m128[2] = fVar1 * fVar6 + fVar2 * fVar10 + fVar3 * fVar14 + fVar18;
  (in_RDI->v0).field_0.m128[3] = fVar1 * fVar7 + fVar2 * fVar11 + fVar3 * fVar15 + fVar19;
  (in_RDI->v1).field_0.m128[0] = fVar20 * fVar4 + fVar21 * fVar8 + fVar22 * fVar12 + fVar16;
  (in_RDI->v1).field_0.m128[1] = fVar20 * fVar5 + fVar21 * fVar9 + fVar22 * fVar13 + fVar17;
  (in_RDI->v1).field_0.m128[2] = fVar20 * fVar6 + fVar21 * fVar10 + fVar22 * fVar14 + fVar18;
  (in_RDI->v1).field_0.m128[3] = fVar20 * fVar7 + fVar21 * fVar11 + fVar22 * fVar15 + fVar19;
  (in_RDI->v2).field_0.m128[0] = fVar23 * fVar4 + fVar24 * fVar8 + fVar25 * fVar12 + fVar16;
  (in_RDI->v2).field_0.m128[1] = fVar23 * fVar5 + fVar24 * fVar9 + fVar25 * fVar13 + fVar17;
  (in_RDI->v2).field_0.m128[2] = fVar23 * fVar6 + fVar24 * fVar10 + fVar25 * fVar14 + fVar18;
  (in_RDI->v2).field_0.m128[3] = fVar23 * fVar7 + fVar24 * fVar11 + fVar25 * fVar15 + fVar19;
  (in_RDI->v3).field_0.m128[0] = fVar26 * fVar4 + fVar27 * fVar8 + fVar28 * fVar12 + fVar16;
  (in_RDI->v3).field_0.m128[1] = fVar26 * fVar5 + fVar27 * fVar9 + fVar28 * fVar13 + fVar17;
  (in_RDI->v3).field_0.m128[2] = fVar26 * fVar6 + fVar27 * fVar10 + fVar28 * fVar14 + fVar18;
  (in_RDI->v3).field_0.m128[3] = fVar26 * fVar7 + fVar27 * fVar11 + fVar28 * fVar15 + fVar19;
  uVar29 = *(undefined8 *)((long)&(this->L).field_0 + 8);
  *(undefined8 *)&(in_RDI->L).field_0 = *(undefined8 *)&(this->L).field_0;
  *(undefined8 *)((long)&(in_RDI->L).field_0 + 8) = uVar29;
  return in_RDI;
}

Assistant:

QuadLight transform(const AffineSpace3fa& space) const {
        return QuadLight(xfmPoint(space,v0),xfmPoint(space,v1),xfmPoint(space,v2),xfmPoint(space,v3),L);
      }